

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error externalParEntInitProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  XML_Error result;
  char **nextPtr_local;
  char *end_local;
  char *s_local;
  XML_Parser parser_local;
  
  parser_local._4_4_ = initializeEncoding(parser);
  if (parser_local._4_4_ == XML_ERROR_NONE) {
    parser->m_dtd->paramEntityRead = '\x01';
    if ((parser->m_prologState).inEntityValue == 0) {
      parser->m_processor = externalParEntProcessor;
      parser_local._4_4_ = externalParEntProcessor(parser,s,end,nextPtr);
    }
    else {
      parser->m_processor = entityValueInitProcessor;
      parser_local._4_4_ = entityValueInitProcessor(parser,s,end,nextPtr);
    }
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error PTRCALL
externalParEntInitProcessor(XML_Parser parser, const char *s, const char *end,
                            const char **nextPtr) {
  enum XML_Error result = initializeEncoding(parser);
  if (result != XML_ERROR_NONE)
    return result;

  /* we know now that XML_Parse(Buffer) has been called,
     so we consider the external parameter entity read */
  parser->m_dtd->paramEntityRead = XML_TRUE;

  if (parser->m_prologState.inEntityValue) {
    parser->m_processor = entityValueInitProcessor;
    return entityValueInitProcessor(parser, s, end, nextPtr);
  } else {
    parser->m_processor = externalParEntProcessor;
    return externalParEntProcessor(parser, s, end, nextPtr);
  }
}